

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O2

void __thiscall TPZMHMixedMeshControl::CreateInternalFluxElements(TPZMHMixedMeshControl *this)

{
  TPZGeoMesh *this_00;
  TPZCompMesh *this_01;
  long *plVar1;
  long subdomain;
  int64_t iel;
  int iVar2;
  mapped_type *this_02;
  TPZGeoEl *pTVar3;
  TPZCompEl *cel;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long *plVar7;
  int i;
  long lVar8;
  long lVar9;
  bool bVar10;
  TPZCompMesh *cmeshHDiv;
  TPZManVector<std::pair<long,_long>,_10> MHMOfEachGeoEl;
  
  this_00 = ((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer;
  iVar2 = this_00->fDim;
  this_01 = ((this->fFluxMesh).fRef)->fPointer;
  cmeshHDiv = this_01;
  TPZGeoMesh::ResetReference(this_00);
  TPZCompMesh::LoadReferences(this_01);
  this_01->fDimModel = iVar2;
  TPZCreateApproximationSpace::SetAllCreateFunctionsHDiv(&this_01->fCreate,iVar2);
  this_01->fDefaultOrder = (this->super_TPZMHMeshControl).fpOrderInternal;
  this_02 = std::
            map<TPZCompMesh_*,_TPZManVector<long,_10>,_std::less<TPZCompMesh_*>,_std::allocator<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_>_>
            ::operator[](&(this->super_TPZMHMeshControl).fConnectToSubDomainIdentifier,&cmeshHDiv);
  TPZManVector<long,_10>::Expand(this_02,10000);
  lVar9 = (((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer->fElementVec).
          super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  if ((this->super_TPZMHMeshControl).fGeoToMHMDomain.super_TPZVec<long>.fNElements == lVar9) {
    TPZManVector<std::pair<long,_long>,_10>::TPZManVector(&MHMOfEachGeoEl,lVar9);
    plVar1 = (this->super_TPZMHMeshControl).fGeoToMHMDomain.super_TPZVec<long>.fStore;
    lVar4 = 0;
    lVar5 = 0;
    if (0 < lVar9) {
      lVar5 = lVar9;
    }
    plVar7 = &(MHMOfEachGeoEl.super_TPZVec<std::pair<long,_long>_>.fStore)->second;
    for (; lVar5 != lVar4; lVar4 = lVar4 + 1) {
      ((pair<long,_long> *)(plVar7 + -1))->first = plVar1[lVar4];
      *plVar7 = lVar4;
      plVar7 = plVar7 + 2;
    }
    std::__sort<std::pair<long,long>*,__gnu_cxx::__ops::_Iter_less_iter>
              (MHMOfEachGeoEl.super_TPZVec<std::pair<long,_long>_>.fStore,
               MHMOfEachGeoEl.super_TPZVec<std::pair<long,_long>_>.fStore + lVar9);
    lVar9 = -1;
    lVar5 = lVar9;
    for (lVar4 = 0; iVar2 = (int)lVar9,
        lVar4 < MHMOfEachGeoEl.super_TPZVec<std::pair<long,_long>_>.fNElements; lVar4 = lVar4 + 1) {
      subdomain = MHMOfEachGeoEl.super_TPZVec<std::pair<long,_long>_>.fStore[lVar4].first;
      if (subdomain != -1) {
        iel = MHMOfEachGeoEl.super_TPZVec<std::pair<long,_long>_>.fStore[lVar4].second;
        if ((subdomain != lVar5) && (bVar10 = lVar5 != -1, lVar9 = lVar4, lVar5 = subdomain, bVar10)
           ) {
          lVar8 = (long)iVar2;
          uVar6 = lVar8 << 4 | 8;
          for (; lVar8 < lVar4; lVar8 = lVar8 + 1) {
            pTVar3 = TPZGeoMesh::Element(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer,
                                         *(int64_t *)
                                          ((long)&(MHMOfEachGeoEl.
                                                   super_TPZVec<std::pair<long,_long>_>.fStore)->
                                                  first + uVar6));
            pTVar3->fReference = (TPZCompEl *)0x0;
            uVar6 = uVar6 + 0x10;
          }
        }
        pTVar3 = TPZGeoMesh::Element(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer,iel);
        if ((pTVar3 != (TPZGeoEl *)0x0) &&
           (iVar2 = (**(code **)(*(long *)pTVar3 + 0x1d0))(pTVar3), iVar2 == 0)) {
          cel = TPZCompMesh::CreateCompEl(cmeshHDiv,pTVar3);
          TPZMHMeshControl::SetSubdomain(&this->super_TPZMHMeshControl,cel,subdomain);
        }
      }
    }
    lVar9 = (long)iVar2;
    uVar6 = lVar9 << 4 | 8;
    for (; lVar9 < MHMOfEachGeoEl.super_TPZVec<std::pair<long,_long>_>.fNElements; lVar9 = lVar9 + 1
        ) {
      pTVar3 = TPZGeoMesh::Element(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer,
                                   *(int64_t *)
                                    ((long)&(MHMOfEachGeoEl.super_TPZVec<std::pair<long,_long>_>.
                                            fStore)->first + uVar6));
      pTVar3->fReference = (TPZCompEl *)0x0;
      uVar6 = uVar6 + 0x10;
    }
    (**(code **)(*(long *)((this->fFluxMesh).fRef)->fPointer + 0x60))();
    TPZManVector<std::pair<long,_long>,_10>::~TPZManVector(&MHMOfEachGeoEl);
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
             ,0x3c7);
}

Assistant:

void TPZMHMixedMeshControl::CreateInternalFluxElements() {
    TPZGeoMesh *gmesh = fGMesh.operator->();
    int meshdim = gmesh->Dimension();
    TPZCompMesh *cmeshHDiv = fFluxMesh.operator->();
    gmesh->ResetReference();
    cmeshHDiv->LoadReferences();
    cmeshHDiv->SetDimModel(meshdim);
    cmeshHDiv->ApproxSpace().SetAllCreateFunctionsHDiv(meshdim);
    cmeshHDiv->SetDefaultOrder(fpOrderInternal);

    // Create MHM computational elements
    fConnectToSubDomainIdentifier[cmeshHDiv].Expand(10000);
    int64_t nel = fGMesh->NElements();

    if (fGeoToMHMDomain.size() != nel) DebugStop();

    TPZManVector<std::pair<int64_t, int64_t>> MHMOfEachGeoEl(nel);
    for (int i = 0; i < nel; i++) {
        MHMOfEachGeoEl[i] = std::make_pair(fGeoToMHMDomain[i], i);
    }

    std::sort(&MHMOfEachGeoEl[0], &MHMOfEachGeoEl[nel - 1] + 1);

    int64_t previousMHMDomain = -1;
    int64_t firstElemInMHMDomain = -1;
    for (int i = 0; i < MHMOfEachGeoEl.size(); i++) {
        int64_t MHMDomain = MHMOfEachGeoEl[i].first;
        int64_t elIndex = MHMOfEachGeoEl[i].second;

        if (MHMDomain == -1) continue;

        if (MHMDomain != previousMHMDomain) {
            if (previousMHMDomain != -1) {
                for (int j = firstElemInMHMDomain; j < i; j++) {
                    fGMesh->Element(MHMOfEachGeoEl[j].second)->ResetReference();
                }
            }
            firstElemInMHMDomain = i;
            previousMHMDomain = MHMDomain;
        }

        // Create the flux element
        TPZGeoEl *gel = fGMesh->Element(elIndex);
        if (!gel || gel->HasSubElement()) continue;
        TPZCompEl* cel = cmeshHDiv->CreateCompEl(gel);
//        TPZCompEl *cel = cmeshHDiv->Element(index);
        // Associate the connects with the subdomain for the flux mesh
        SetSubdomain(cel, MHMDomain);
    }
    // Resets references of last MHM domain
    for (int j = firstElemInMHMDomain; j < MHMOfEachGeoEl.size(); j++) {
        fGMesh->Element(MHMOfEachGeoEl[j].second)->ResetReference();
    }

    fFluxMesh->ExpandSolution();
}